

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lprowsetbase.h
# Opt level: O0

void __thiscall soplex::LPRowSetBase<double>::clear(LPRowSetBase<double> *this)

{
  long in_RDI;
  bool in_stack_0000000b;
  int in_stack_0000000c;
  VectorBase<double> *in_stack_00000010;
  undefined8 in_stack_ffffffffffffffd8;
  SVSetBase<double> *in_stack_ffffffffffffffe0;
  
  SVSetBase<double>::clear
            (in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  num((LPRowSetBase<double> *)0x2628d2);
  VectorBase<double>::reDim(in_stack_00000010,in_stack_0000000c,in_stack_0000000b);
  num((LPRowSetBase<double> *)0x2628fa);
  VectorBase<double>::reDim(in_stack_00000010,in_stack_0000000c,in_stack_0000000b);
  num((LPRowSetBase<double> *)0x262923);
  VectorBase<double>::reDim(in_stack_00000010,in_stack_0000000c,in_stack_0000000b);
  DataArray<int>::clear((DataArray<int> *)(in_RDI + 0xb0));
  return;
}

Assistant:

void clear()
   {
      SVSetBase<R>::clear();
      left.reDim(num());
      right.reDim(num());
      object.reDim(num());
      scaleExp.clear();
   }